

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

QDomNodePrivate * __thiscall
QDomNamedNodeMapPrivate::setNamedItemNS(QDomNamedNodeMapPrivate *this,QDomNodePrivate *arg)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  long in_RSI;
  QDomNamedNodeMapPrivate *in_RDI;
  long in_FS_OFFSET;
  QDomNodePrivate *in_stack_00000008;
  QDomNodePrivate *n;
  QDomNodePrivate *in_stack_ffffffffffffff88;
  QDomNodePrivate **in_stack_ffffffffffffff90;
  QMultiHash<QString,_QDomNodePrivate_*> *key;
  QString *in_stack_ffffffffffffffa8;
  QDomNamedNodeMapPrivate *this_00;
  QDomNodePrivate *local_48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((in_RDI->readonly & 1U) == 0) && (in_RSI != 0)) {
    if ((in_RDI->appendToParent & 1U) == 0) {
      this_00 = in_RDI;
      bVar2 = QString::isNull((QString *)0x11285d);
      if (bVar2) {
        local_48 = setNamedItem(this_00,in_stack_00000008);
      }
      else {
        local_48 = namedItemNS(this_00,in_stack_ffffffffffffffa8,(QString *)in_RDI);
        QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x112893);
        key = &in_RDI->map;
        QDomNodePrivate::nodeName(in_stack_ffffffffffffff88);
        QMultiHash<QString,_QDomNodePrivate_*>::insert
                  ((QMultiHash<QString,_QDomNodePrivate_*> *)in_RDI,(QString *)key,
                   in_stack_ffffffffffffff90);
        QString::~QString((QString *)0x1128d3);
      }
    }
    else {
      iVar3 = (*in_RDI->parent->_vptr_QDomNodePrivate[7])(in_RDI->parent,in_RSI);
      local_48 = (QDomNodePrivate *)CONCAT44(extraout_var,iVar3);
    }
  }
  else {
    local_48 = (QDomNodePrivate *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_48;
  }
  __stack_chk_fail();
}

Assistant:

QDomNodePrivate* QDomNamedNodeMapPrivate::setNamedItemNS(QDomNodePrivate* arg)
{
    if (readonly || !arg)
        return nullptr;

    if (appendToParent)
        return parent->appendChild(arg);

    if (!arg->prefix.isNull()) {
        // node has a namespace
        QDomNodePrivate *n = namedItemNS(arg->namespaceURI, arg->name);
        // We take a reference
        arg->ref.ref();
        map.insert(arg->nodeName(), arg);
        return n;
    } else {
        // ### check the following code if it is ok
        return setNamedItem(arg);
    }
}